

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

int uv__cpu_num(FILE *statfile_fp,uint *numcpus)

{
  int iVar1;
  char *pcVar2;
  char local_428 [8];
  char buf [1024];
  uint num;
  uint *numcpus_local;
  FILE *statfile_fp_local;
  
  pcVar2 = fgets(local_428,0x400,(FILE *)statfile_fp);
  if (pcVar2 == (char *)0x0) {
    statfile_fp_local._4_4_ = -5;
  }
  else {
    buf[0x3fc] = '\0';
    buf[0x3fd] = '\0';
    buf[0x3fe] = '\0';
    buf[0x3ff] = '\0';
    while ((pcVar2 = fgets(local_428,0x400,(FILE *)statfile_fp), pcVar2 != (char *)0x0 &&
           (iVar1 = strncmp(local_428,"cpu",3), iVar1 == 0))) {
      buf._1020_4_ = buf._1020_4_ + 1;
    }
    if (buf._1020_4_ == 0) {
      statfile_fp_local._4_4_ = -5;
    }
    else {
      *numcpus = buf._1020_4_;
      statfile_fp_local._4_4_ = 0;
    }
  }
  return statfile_fp_local._4_4_;
}

Assistant:

static int uv__cpu_num(FILE* statfile_fp, unsigned int* numcpus) {
  unsigned int num;
  char buf[1024];

  if (!fgets(buf, sizeof(buf), statfile_fp))
    return UV_EIO;

  num = 0;
  while (fgets(buf, sizeof(buf), statfile_fp)) {
    if (strncmp(buf, "cpu", 3))
      break;
    num++;
  }

  if (num == 0)
    return UV_EIO;

  *numcpus = num;
  return 0;
}